

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_connect(void)

{
  ostream *poVar1;
  int iVar2;
  allocator local_421;
  string str;
  rpc_client client;
  
  rest_rpc::rpc_client::rpc_client(&client);
  client.enable_reconnect_ = true;
  client.reconnect_cnt_ = 0x7fffffff;
  rest_rpc::rpc_client::reset_deadline_timer(&client,5);
  std::__cxx11::string::string((string *)&str,"127.0.0.1",&local_421);
  iVar2 = 0;
  rest_rpc::rpc_client::connect(&client,(int)&str,(sockaddr *)0x2328,0);
  std::__cxx11::string::~string((string *)&str);
  while (((byte)client.has_connected_._M_base._M_i & 1) == 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"connected failed: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,"\n");
    str._M_dataplus._M_p = (pointer)0x1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>((duration<long,_std::ratio<1L,_1L>_> *)&str)
    ;
    iVar2 = iVar2 + 1;
  }
  std::operator<<((ostream *)&std::cout,"connected ok\n");
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&str);
  std::__cxx11::string::~string((string *)&str);
  rest_rpc::rpc_client::~rpc_client(&client);
  return;
}

Assistant:

void test_connect() {
  rpc_client client;
  client.enable_auto_reconnect(); // automatic reconnect
  client.enable_auto_heartbeat(); // automatic heartbeat
  bool r = client.connect("127.0.0.1", 9000);
  int count = 0;
  while (true) {
    if (client.has_connected()) {
      std::cout << "connected ok\n";
      break;
    } else {
      std::cout << "connected failed: " << count++ << "\n";
    }
    std::this_thread::sleep_for(std::chrono::seconds(1));
  }

  //{
  //	rpc_client client;
  //	bool r = client.connect("127.0.0.1", 9000);
  //	int count = 0;
  //	while (true) {
  //		if (client.connect()) {
  //			std::cout << "connected ok\n";
  //			break;
  //		}
  //		else {
  //			std::cout << "connected failed: " << count++ << "\n";
  //		}
  //	}
  //}

  std::string str;
  std::cin >> str;
}